

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_domain.c
# Opt level: O2

_Bool nhdp_domain_set_incoming_metric(nhdp_domain_metric *metric,nhdp_link *lnk,uint32_t metric_in)

{
  int iVar1;
  _Bool _Var2;
  uint32_t uVar3;
  uint64_t uVar4;
  list_entity *plVar5;
  list_entity *plVar6;
  
  plVar5 = &_domain_list;
  _Var2 = false;
  while (plVar5 = plVar5->next, plVar5->prev != _domain_list.prev) {
    if ((nhdp_domain_metric *)plVar5[-0x28].next == metric) {
      iVar1 = *(int *)((long)&plVar5[-0x27].next + 4);
      plVar6 = &_domain_metric_postprocessor_list;
      uVar3 = metric_in;
      while (plVar6 = plVar6->next, plVar6->prev != _domain_metric_postprocessor_list.prev) {
        uVar3 = (*(code *)plVar6[-1].prev)(plVar5 + -0x2a,lnk,uVar3);
      }
      if (lnk->_domaindata[iVar1].metric.in != uVar3) {
        uVar4 = oonf_clock_getNow();
        lnk->_domaindata[iVar1].last_metric_change = uVar4;
        _Var2 = true;
      }
      lnk->_domaindata[iVar1].metric.in = uVar3;
    }
  }
  return _Var2;
}

Assistant:

bool
nhdp_domain_set_incoming_metric(struct nhdp_domain_metric *metric, struct nhdp_link *lnk, uint32_t metric_in) {
  struct nhdp_domain_metric_postprocessor *processor;
  struct nhdp_link_domaindata *linkdata;
  struct nhdp_domain *domain;
  uint32_t new_metric;
  bool changed;

  changed = false;

  list_for_each_element(&_domain_list, domain, _node) {
    if (domain->metric == metric) {
      linkdata = nhdp_domain_get_linkdata(domain, lnk);
      new_metric = metric_in;

      list_for_each_element(&_domain_metric_postprocessor_list, processor, _node) {
        new_metric = processor->process_in_metric(domain, lnk, new_metric);
      }

      if (linkdata->metric.in != new_metric) {
        changed = true;
        linkdata->last_metric_change = oonf_clock_getNow();
      }
      linkdata->metric.in = new_metric;
    }
  }
  return changed;
}